

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O3

bool testExtendAndPrepend<CyclicHash<unsigned_int,unsigned_char>>(uint L)

{
  uint uVar1;
  ostream *poVar2;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  string prepend;
  string extend;
  string base;
  string input;
  CyclicHash<unsigned_int,_unsigned_char> hf;
  char *local_4c8;
  ulong local_4c0;
  char local_4b8 [16];
  char *local_4a8;
  ulong local_4a0;
  char local_498 [16];
  char *local_488;
  ulong local_480;
  char local_478 [16];
  byte *local_468;
  long local_460;
  byte local_458 [16];
  CyclicHash<unsigned_int,_unsigned_char> local_448;
  
  CyclicHash<unsigned_int,_unsigned_char>::CyclicHash(&local_448,4,L);
  local_468 = local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"XABCDY","");
  local_488 = local_478;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)&local_488,local_468 + 1,local_468 + local_460 + -1);
  if (local_480 != 4) {
    __assert_fail("base.size() == n",
                  "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                  ,0x11,"bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<>]");
  }
  local_4a8 = local_498;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)&local_4a8,local_468 + 1,local_468 + local_460);
  local_4c8 = local_4b8;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)&local_4c8,local_468,local_468 + local_460 + -1);
  if (local_480 == 0) {
LAB_001041a8:
    uVar1 = 0;
  }
  else {
    uVar4 = 0;
    do {
      local_448.hashvalue =
           (local_448.hashvalue >> ((char)local_448.wordsize - 1U & 0x1f) |
           (local_448.mask1 & local_448.hashvalue) * 2) ^
           local_448.hasher.hashvalues[(byte)local_488[uVar4]];
      uVar4 = uVar4 + 1;
    } while (local_480 != uVar4);
    if (local_480 == 0) goto LAB_001041a8;
    uVar4 = 0;
    uVar1 = 0;
    do {
      uVar1 = (uVar1 >> ((char)local_448.wordsize - 1U & 0x1f) | (uVar1 & local_448.mask1) * 2) ^
              local_448.hasher.hashvalues[(uint)(int)local_488[uVar4]];
      uVar4 = uVar4 + 1;
    } while ((uVar4 & 0xffffffff) < local_480);
  }
  if (local_448.hashvalue == uVar1) {
    uVar1 = local_448.hasher.hashvalues[*local_468];
    uVar1 = (uVar1 >> ((char)local_448.wordsize - (byte)local_448.myr & 0x1f) |
            (local_448.maskn & uVar1) << ((byte)local_448.myr & 0x1f)) ^ local_448.hashvalue;
    if (local_4c0 == 0) {
      uVar6 = 0;
    }
    else {
      uVar4 = 0;
      uVar6 = 0;
      do {
        uVar6 = (uVar6 >> ((char)local_448.wordsize - 1U & 0x1f) | (uVar6 & local_448.mask1) * 2) ^
                local_448.hasher.hashvalues[(uint)(int)local_4c8[uVar4]];
        uVar4 = uVar4 + 1;
      } while ((uVar4 & 0xffffffff) < local_4c0);
    }
    if (uVar1 == uVar6) {
      bVar3 = (char)local_448.wordsize - 1;
      uVar6 = (local_448.hashvalue >> (bVar3 & 0x1f) | (local_448.mask1 & local_448.hashvalue) * 2)
              ^ local_448.hasher.hashvalues[local_468[local_460 + -1]];
      if (local_4a0 == 0) {
        uVar7 = 0;
      }
      else {
        uVar4 = 0;
        uVar7 = 0;
        do {
          uVar7 = (uVar7 >> (bVar3 & 0x1f) | (uVar7 & local_448.mask1) * 2) ^
                  local_448.hasher.hashvalues[(uint)(int)local_4a8[uVar4]];
          uVar4 = uVar4 + 1;
        } while ((uVar4 & 0xffffffff) < local_4a0);
      }
      if (uVar6 == uVar7) {
        if (local_480 == 0) {
          uVar7 = 0;
        }
        else {
          uVar4 = 0;
          uVar7 = 0;
          do {
            uVar7 = (uVar7 >> (bVar3 & 0x1f) | (uVar7 & local_448.mask1) * 2) ^
                    local_448.hasher.hashvalues[(uint)(int)local_488[uVar4]];
            uVar4 = uVar4 + 1;
          } while ((uVar4 & 0xffffffff) < local_480);
        }
        if (local_448.hashvalue != uVar7) {
          __assert_fail("hf.hashvalue == hf.hash(base)",
                        "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                        ,0x2a,"bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<>]");
        }
        if (local_4c0 == 0) {
          uVar7 = 0;
        }
        else {
          uVar4 = 0;
          uVar7 = 0;
          do {
            uVar7 = (uVar7 >> (bVar3 & 0x1f) | (uVar7 & local_448.mask1) * 2) ^
                    local_448.hasher.hashvalues[(uint)(int)local_4c8[uVar4]];
            uVar4 = uVar4 + 1;
          } while ((uVar4 & 0xffffffff) < local_4c0);
        }
        if (uVar1 != uVar7) {
          __assert_fail("hf.hash_prepend(input[0]) == hf.hash(prepend)",
                        "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                        ,0x2b,"bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<>]");
        }
        if (local_4a0 == 0) {
          uVar1 = 0;
        }
        else {
          uVar4 = 0;
          uVar1 = 0;
          do {
            uVar1 = (uVar1 >> (bVar3 & 0x1f) | (uVar1 & local_448.mask1) * 2) ^
                    local_448.hasher.hashvalues[(uint)(int)local_4a8[uVar4]];
            uVar4 = uVar4 + 1;
          } while ((uVar4 & 0xffffffff) < local_4a0);
        }
        bVar5 = true;
        if (uVar6 != uVar1) {
          __assert_fail("hf.hash_extend(input.back()) == hf.hash(extend)",
                        "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                        ,0x2c,"bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<>]");
        }
        goto LAB_0010468f;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bug!",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_4a8,local_4a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      if (local_4a0 != 0) {
        uVar1 = 0;
        do {
          uVar1 = uVar1 + 1;
        } while (uVar1 < local_4a0);
      }
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bug!",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_4c8,local_4c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      if (local_4c0 != 0) {
        uVar1 = 0;
        do {
          uVar1 = uVar1 + 1;
        } while (uVar1 < local_4c0);
      }
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bug!",4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_488,local_480);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    if (local_480 != 0) {
      uVar1 = 0;
      do {
        uVar1 = uVar1 + 1;
      } while (uVar1 < local_480);
    }
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  }
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  bVar5 = false;
LAB_0010468f:
  if (local_4c8 != local_4b8) {
    operator_delete(local_4c8);
  }
  if (local_4a8 != local_498) {
    operator_delete(local_4a8);
  }
  if (local_488 != local_478) {
    operator_delete(local_488);
  }
  if (local_468 != local_458) {
    operator_delete(local_468);
  }
  return bVar5;
}

Assistant:

bool testExtendAndPrepend(uint L = 19) {
  const uint n(4); // n-grams
  hashfunction hf(n, L);
  string input = "XABCDY";
  string base(input.begin() + 1, input.end() - 1);
  assert(base.size() == n);
  string extend(input.begin() + 1, input.end());
  string prepend(input.begin(), input.end() - 1);

  for (string::const_iterator j = base.begin(); j != base.end(); ++j) {
    hf.eat(*j);
  }
  if (hf.hashvalue != hf.hash(base)) {
    std::cout << "bug!" << std::endl;
    std::cout << base << " " << hf.hash(base) << std::endl;
    return false;
  }
  if (hf.hash_prepend(input[0]) != hf.hash(prepend)) {
    std::cout << "bug!" << std::endl;
    std::cout << prepend << " " << hf.hash_prepend(input[0]) << " "
              << hf.hash(prepend) << std::endl;
    return false;
  }
  if (hf.hash_extend(input.back()) != hf.hash(extend)) {
    std::cout << "bug!" << std::endl;
    std::cout << extend << " " << hf.hash_extend(input.back()) << " "
              << hf.hash(extend) << std::endl;
    return false;
  }

  assert(hf.hashvalue == hf.hash(base));
  assert(hf.hash_prepend(input[0]) == hf.hash(prepend));
  assert(hf.hash_extend(input.back()) == hf.hash(extend));

  return true;
}